

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
::Iterator::Equals(Iterator *this,
                  ParamIteratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
                  *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  Iterator *pIVar5;
  GTestLog local_1c;
  
  iVar2 = (*(this->
            super_ParamIteratorInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x156);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::endl<char,std::char_traits<char>>(poVar4);
    GTestLog::~GTestLog(&local_1c);
  }
  pIVar5 = CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>>::Iterator_const,testing::internal::ParamIteratorInterface<std::tuple<int,int(*)(short_const*,short_const*,int),int(*)(short_const*,short_const*,int)>>const>
                     (other);
  return (this->iterator_)._M_current == (pIVar5->iterator_)._M_current;
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
             CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }